

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O3

RPCManagerPtr * miniros::RPCManager::instance(void)

{
  int iVar1;
  undefined1 local_9;
  
  if (instance()::xmlrpc_manager == '\0') {
    iVar1 = __cxa_guard_acquire(&instance()::xmlrpc_manager);
    if (iVar1 != 0) {
      instance::xmlrpc_manager.super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<miniros::RPCManager,std::allocator<miniros::RPCManager>>
                (&instance::xmlrpc_manager.
                  super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (RPCManager **)&instance::xmlrpc_manager,(allocator<miniros::RPCManager> *)&local_9
                );
      __cxa_atexit(std::__shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>::~__shared_ptr
                   ,&instance::xmlrpc_manager,&__dso_handle);
      __cxa_guard_release(&instance()::xmlrpc_manager);
    }
  }
  return &instance::xmlrpc_manager;
}

Assistant:

const RPCManagerPtr& RPCManager::instance()
{
  static RPCManagerPtr xmlrpc_manager = std::make_shared<RPCManager>();
  return xmlrpc_manager;
}